

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O2

bool __thiscall
ReplayInterface::enqueue_create_graphics_pipeline
          (ReplayInterface *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  bool bVar2;
  Hash recorded_hash;
  Hash local_28;
  
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline(&this->recorder,create_info,&local_28);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, local_28 == hash)) {
    *pipeline = (VkPipeline)hash;
    bVar2 = Fossilize::StateRecorder::record_graphics_pipeline
                      (&this->recorder,(VkPipeline)hash,create_info,(VkPipeline *)0x0,0,0,
                       (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  }
  return bVar2;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_graphics_pipeline(recorder, *create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*pipeline = fake_handle<VkPipeline>(hash);
		return recorder.record_graphics_pipeline(*pipeline, *create_info, nullptr, 0);
	}